

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O1

void __thiscall FusionEKF::~FusionEKF(FusionEKF *this)

{
  this->_vptr_FusionEKF = (_func_int **)&PTR__FusionEKF_0011cce8;
  free((this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  free((this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free((this->R_radar_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free((this->R_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  Tools::~Tools(&this->tools);
  KalmanFilter::~KalmanFilter(&this->ekf_);
  return;
}

Assistant:

FusionEKF::~FusionEKF() {}